

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O1

uint32_t FACTWave_SetVolume(FACTWave *pWave,float volume)

{
  uint32_t uVar1;
  float fVar2;
  
  if (pWave == (FACTWave *)0x0) {
    uVar1 = 1;
  }
  else {
    FAudio_PlatformLockMutex(pWave->parentBank->parentEngine->apiLock);
    fVar2 = 0.0;
    if (0.0 <= volume) {
      fVar2 = volume;
    }
    fVar2 = (float)(-(uint)(16777216.0 < volume) & 0x4b800000 |
                   ~-(uint)(16777216.0 < volume) & (uint)fVar2);
    pWave->volume = fVar2;
    uVar1 = 0;
    FAudioVoice_SetVolume(pWave->voice,fVar2,0);
    FAudio_PlatformUnlockMutex(pWave->parentBank->parentEngine->apiLock);
  }
  return uVar1;
}

Assistant:

uint32_t FACTWave_SetVolume(FACTWave *pWave, float volume)
{
	if (pWave == NULL)
	{
		return 1;
	}
	FAudio_PlatformLockMutex(pWave->parentBank->parentEngine->apiLock);
	pWave->volume = FAudio_clamp(
		volume,
		FACTVOLUME_MIN,
		FACTVOLUME_MAX
	);
	FAudioVoice_SetVolume(
		pWave->voice,
		pWave->volume,
		0
	);
	FAudio_PlatformUnlockMutex(pWave->parentBank->parentEngine->apiLock);
	return 0;
}